

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_simplifiable_complex.h
# Opt level: O1

void __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::add_simplex
          (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this,
          Simplex *sigma)

{
  bool bVar1;
  int iVar2;
  Vertex_handle VVar3;
  long lVar4;
  _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  _Stack_48;
  
  iVar2 = (*this->_vptr_Skeleton_blocker_complex[9])();
  if ((char)iVar2 != '\0') {
    __assert_fail("!this->contains(sigma)",
                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/include/gudhi/Skeleton_blocker_simplifiable_complex.h"
                  ,0xc6,
                  "void Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::add_simplex(const Simplex &) [SkeletonBlockerDS = Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits]"
                 );
  }
  if (1 < (int)(sigma->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_node_count + -1) {
    bVar1 = contains_vertices(this,sigma);
    if (!bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "add_simplex: Some vertices were not present in the complex, adding them",0x47);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
      std::ostream::put('\b');
      std::ostream::flush();
      VVar3 = Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
              ::last_vertex(sigma);
      iVar2 = (VVar3.vertex + 1) - (int)this->num_vertices_;
      if (iVar2 != 0) {
        lVar4 = (long)(int)(iVar2 + (uint)(iVar2 == 0));
        do {
          add_vertex(this);
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
    }
    bVar1 = contains_vertices(this,sigma);
    if (bVar1) {
      bVar1 = contains_edges(this,sigma);
      if (!bVar1) {
        add_edge(this,sigma);
      }
      remove_blocker_include_in_simplex(this,sigma);
      std::
      _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
      ::_Rb_tree(&_Stack_48,
                 (_Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                  *)sigma);
      add_blockers_after_simplex_insertion(this,(Simplex *)&_Stack_48);
      std::
      _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
      ::~_Rb_tree(&_Stack_48);
      return;
    }
    __assert_fail("contains_vertices(sigma)",
                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/include/gudhi/Skeleton_blocker_simplifiable_complex.h"
                  ,0xce,
                  "void Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::add_simplex(const Simplex &) [SkeletonBlockerDS = Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits]"
                 );
  }
  __assert_fail("sigma.dimension() > 1",
                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/include/gudhi/Skeleton_blocker_simplifiable_complex.h"
                ,199,
                "void Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::add_simplex(const Simplex &) [SkeletonBlockerDS = Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits]"
               );
}

Assistant:

void Skeleton_blocker_complex<SkeletonBlockerDS>::add_simplex(const Simplex& sigma) {
  // to add a simplex s, all blockers included in s are first removed
  // and then all simplex in the coboundary of s are added as blockers
  assert(!this->contains(sigma));
  assert(sigma.dimension() > 1);
  if (!contains_vertices(sigma)) {
    std::cerr << "add_simplex: Some vertices were not present in the complex, adding them" << std::endl;
    size_t num_vertices_to_add = sigma.last_vertex() - this->num_vertices() + 1;
    for (size_t i = 0; i < num_vertices_to_add; ++i)
      this->add_vertex();
  }
  assert(contains_vertices(sigma));
  if (!contains_edges(sigma))
    add_edge(sigma);
  remove_blocker_include_in_simplex(sigma);
  add_blockers_after_simplex_insertion(sigma);
}